

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_type_create_hindexed_block_
               (MPIABI_Fint *count,MPIABI_Fint *blocklength,MPIABI_Fint *array_of_displacements,
               MPIABI_Fint *oldtype,MPIABI_Fint *newtype,MPIABI_Fint *ierror)

{
  mpi_type_create_hindexed_block_();
  return;
}

Assistant:

void mpiabi_type_create_hindexed_block_(
  const MPIABI_Fint * count,
  const MPIABI_Fint * blocklength,
  const MPIABI_Fint * array_of_displacements,
  const MPIABI_Fint * oldtype,
  MPIABI_Fint * newtype,
  MPIABI_Fint * ierror
) {
  return mpi_type_create_hindexed_block_(
    count,
    blocklength,
    array_of_displacements,
    oldtype,
    newtype,
    ierror
  );
}